

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O2

BCReg snap_usedef(jit_State *J,uint8_t *udf,BCIns *pc,BCReg maxslot)

{
  TValue *pTVar1;
  GCRef *pGVar2;
  ulong uVar3;
  byte bVar5;
  ulong uVar4;
  uint uVar6;
  uint *puVar7;
  uint uVar8;
  ushort uVar9;
  uint uVar10;
  ulong uVar11;
  
  if (maxslot != 0) {
    uVar3 = (ulong)maxslot;
    memset(udf,1,uVar3);
    pGVar2 = &J->L->openupval;
    while (pGVar2 = (GCRef *)pGVar2->gcptr64, pGVar2 != (GCRef *)0x0) {
      pTVar1 = J->L->base;
      if (*(TValue **)(pGVar2 + 4) < pTVar1) break;
      udf[(long)*(TValue **)(pGVar2 + 4) - (long)pTVar1 >> 3] = '\0';
    }
    do {
      uVar6 = *pc;
      uVar8 = uVar6 & 0xff;
      uVar9 = lj_bc_mode[uVar8];
      if ((uVar9 & 0x78) == 0x18) {
        udf[uVar6 >> 0x18] = udf[uVar6 >> 0x18] & 0xfe;
      }
      puVar7 = pc + 1;
      bVar5 = (byte)(uVar6 >> 8);
      switch(uVar9 >> 7 & 0xf) {
      case 3:
        udf[uVar6 >> 0x10 & 0xff] = udf[uVar6 >> 0x10 & 0xff] & 0xfe;
        break;
      case 4:
        for (uVar4 = (ulong)(uVar6 >> 0x18); uVar4 <= (uVar6 >> 0x10 & 0xff); uVar4 = uVar4 + 1) {
          udf[uVar4] = udf[uVar4] & 0xfe;
        }
        for (; uVar4 < uVar3; uVar4 = uVar4 + 1) {
          udf[uVar4] = udf[uVar4] * '\x03';
        }
        break;
      case 6:
        uVar10 = (uVar6 & 0xff) - 0x51;
        if ((uVar10 < 7) && ((0x49U >> (uVar10 & 0x1f) & 1) != 0)) goto switchD_0014dbef_caseD_d;
        if (uVar8 - 0x4d < 0xfffffffc) break;
        uVar4 = (ulong)bVar5;
        uVar6 = ((uVar6 >> 0x10) - 1) + (uint)bVar5;
        if (uVar8 == 0x49) {
          uVar6 = maxslot;
        }
        for (uVar11 = 0; uVar4 != uVar11; uVar11 = uVar11 + 1) {
          udf[uVar11] = udf[uVar11] * '\x03';
        }
        for (; uVar4 < uVar6; uVar4 = uVar4 + 1) {
          udf[uVar4] = udf[uVar4] & 0xfe;
        }
        for (; uVar4 < uVar3; uVar4 = uVar4 + 1) {
          udf[uVar4] = udf[uVar4] * '\x03';
        }
        goto LAB_0014dea5;
      case 0xc:
        goto switchD_0014dbef_caseD_c;
      case 0xd:
switchD_0014dbef_caseD_d:
        if (uVar8 - 0x4d < 5) {
          uVar6 = bVar5 + 3;
LAB_0014de1a:
          for (uVar4 = (ulong)uVar6; uVar4 < uVar3; uVar4 = uVar4 + 1) {
            udf[uVar4] = udf[uVar4] * '\x03';
          }
          if (uVar6 < maxslot) {
            return uVar6;
          }
          return maxslot;
        }
        if (uVar8 - 0x52 < 3) {
          uVar6 = ((uint)bVar5 + (uint)*(byte *)((long)pc + -1)) - 1;
          goto LAB_0014de1a;
        }
        if (uVar8 != 0x32) {
          uVar6 = (uint)bVar5;
          goto LAB_0014de1a;
        }
        if (-1 < (int)uVar6) {
          return maxslot;
        }
        puVar7 = puVar7 + ((ulong)(uVar6 >> 0x10) - 0x8000);
      }
      uVar9 = uVar9 & 7;
      pc = puVar7;
      if (uVar9 == 1) {
        if ((uVar6 & 0xfe) != 0xc) {
          uVar6 = uVar6 >> 8 & 0xff;
          udf[uVar6] = udf[uVar6] * '\x03';
        }
      }
      else if (uVar9 == 2) {
        if (uVar8 - 0x41 < 6) {
          uVar4 = uVar3;
          if (((uVar6 & 0xfd) != 0x41) && (uVar10 = uVar6 >> 0x10 & 0xff, uVar10 != 0)) {
            uVar4 = (ulong)(uVar10 + (uVar6 >> 8 & 0xff) + 1);
          }
          uVar6 = uVar6 >> 8 & 0xff;
          udf[(ulong)uVar6 + 1] = udf[(ulong)uVar6 + 1] * '\x03';
          for (uVar11 = (ulong)(((uint)(1 < uVar8 - 0x45) * 3 + uVar6) - 3); uVar11 < uVar4;
              uVar11 = uVar11 + 1) {
            udf[uVar11] = udf[uVar11] & 0xfe;
          }
          for (; uVar11 < uVar3; uVar11 = uVar11 + 1) {
            udf[uVar11] = udf[uVar11] * '\x03';
          }
          if (0xfffffffd < uVar8 - 0x45) {
            for (uVar3 = 0; bVar5 != uVar3; uVar3 = uVar3 + 1) {
              udf[uVar3] = udf[uVar3] * '\x03';
            }
            return 0;
          }
        }
        else if ((char)uVar6 == ',') {
          for (uVar4 = (ulong)bVar5; uVar4 <= uVar6 >> 0x10; uVar4 = uVar4 + 1) {
            udf[uVar4] = udf[uVar4] * '\x03';
          }
        }
        else if ((uVar6 & 0xff) == 0x3f) {
          for (uVar4 = (ulong)(bVar5 - 1); uVar4 < uVar3; uVar4 = uVar4 + 1) {
            udf[uVar4] = udf[uVar4] & 0xfe;
          }
        }
        else if ((uVar6 & 0xff) == 0x47) {
          return maxslot;
        }
      }
      else if (uVar9 == 3) {
        udf[uVar6 >> 8 & 0xff] = udf[uVar6 >> 8 & 0xff] & 0xfe;
      }
    } while( true );
  }
LAB_0014dea5:
  maxslot = 0;
switchD_0014dbef_caseD_c:
  return maxslot;
}

Assistant:

static BCReg snap_usedef(jit_State *J, uint8_t *udf,
			 const BCIns *pc, BCReg maxslot)
{
  BCReg s;
  GCobj *o;

  if (maxslot == 0) return 0;
#ifdef LUAJIT_USE_VALGRIND
  /* Avoid errors for harmless reads beyond maxslot. */
  memset(udf, 1, SNAP_USEDEF_SLOTS);
#else
  memset(udf, 1, maxslot);
#endif

  /* Treat open upvalues as used. */
  o = gcref(J->L->openupval);
  while (o) {
    if (uvval(gco2uv(o)) < J->L->base) break;
    udf[uvval(gco2uv(o)) - J->L->base] = 0;
    o = gcref(o->gch.nextgc);
  }

#define USE_SLOT(s)		udf[(s)] &= ~1
#define DEF_SLOT(s)		udf[(s)] *= 3

  /* Scan through following bytecode and check for uses/defs. */
  lj_assertJ(pc >= proto_bc(J->pt) && pc < proto_bc(J->pt) + J->pt->sizebc,
	     "snapshot PC out of range");
  for (;;) {
    BCIns ins = *pc++;
    BCOp op = bc_op(ins);
    switch (bcmode_b(op)) {
    case BCMvar: USE_SLOT(bc_b(ins)); break;
    default: break;
    }
    switch (bcmode_c(op)) {
    case BCMvar: USE_SLOT(bc_c(ins)); break;
    case BCMrbase:
      lj_assertJ(op == BC_CAT, "unhandled op %d with RC rbase", op);
      for (s = bc_b(ins); s <= bc_c(ins); s++) USE_SLOT(s);
      for (; s < maxslot; s++) DEF_SLOT(s);
      break;
    case BCMjump:
    handle_jump: {
      BCReg minslot = bc_a(ins);
      if (op >= BC_FORI && op <= BC_JFORL) minslot += FORL_EXT;
      else if (op >= BC_ITERL && op <= BC_JITERL) minslot += bc_b(pc[-2])-1;
      else if (op == BC_UCLO) {
	ptrdiff_t delta = bc_j(ins);
	if (delta < 0) return maxslot;  /* Prevent loop. */
	pc += delta;
	break;
      }
      for (s = minslot; s < maxslot; s++) DEF_SLOT(s);
      return minslot < maxslot ? minslot : maxslot;
      }
    case BCMlit:
      if (op == BC_JFORL || op == BC_JITERL || op == BC_JLOOP) {
	goto handle_jump;
      } else if (bc_isret(op)) {
	BCReg top = op == BC_RETM ? maxslot : (bc_a(ins) + bc_d(ins)-1);
	for (s = 0; s < bc_a(ins); s++) DEF_SLOT(s);
	for (; s < top; s++) USE_SLOT(s);
	for (; s < maxslot; s++) DEF_SLOT(s);
	return 0;
      }
      break;
    case BCMfunc: return maxslot;  /* NYI: will abort, anyway. */
    default: break;
    }
    switch (bcmode_a(op)) {
    case BCMvar: USE_SLOT(bc_a(ins)); break;
    case BCMdst:
       if (!(op == BC_ISTC || op == BC_ISFC)) DEF_SLOT(bc_a(ins));
       break;
    case BCMbase:
      if (op >= BC_CALLM && op <= BC_ITERN) {
	BCReg top = (op == BC_CALLM || op == BC_CALLMT || bc_c(ins) == 0) ?
		    maxslot : (bc_a(ins) + bc_c(ins)+LJ_FR2);
	if (LJ_FR2) DEF_SLOT(bc_a(ins)+1);
	s = bc_a(ins) - ((op == BC_ITERC || op == BC_ITERN) ? 3 : 0);
	for (; s < top; s++) USE_SLOT(s);
	for (; s < maxslot; s++) DEF_SLOT(s);
	if (op == BC_CALLT || op == BC_CALLMT) {
	  for (s = 0; s < bc_a(ins); s++) DEF_SLOT(s);
	  return 0;
	}
      } else if (op == BC_VARG) {
	return maxslot;  /* NYI: punt. */
      } else if (op == BC_KNIL) {
	for (s = bc_a(ins); s <= bc_d(ins); s++) DEF_SLOT(s);
      } else if (op == BC_TSETM) {
	for (s = bc_a(ins)-1; s < maxslot; s++) USE_SLOT(s);
      }
      break;
    default: break;
    }
    lj_assertJ(pc >= proto_bc(J->pt) && pc < proto_bc(J->pt) + J->pt->sizebc,
	       "use/def analysis PC out of range");
  }

#undef USE_SLOT
#undef DEF_SLOT

  return 0;  /* unreachable */
}